

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.hpp
# Opt level: O2

vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
* __thiscall
tandem::detail::get_sorted_buckets<std::__cxx11::string>
          (vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
           *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,
          vector<tandem::LZBlock,_std::allocator<tandem::LZBlock>_> *lz_blocks,uint32_t min_period,
          uint32_t max_period)

{
  pointer pRVar1;
  vector<tandem::Repeat,_std::allocator<tandem::Repeat>_> *bucket;
  pointer this_00;
  Repeat *run;
  pointer pRVar2;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  end_buckets;
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  local_40;
  
  get_end_buckets<std::__cxx11::string>(&local_40,this,str,lz_blocks,min_period,max_period);
  get_init_buckets(__return_storage_ptr__,*(size_t *)(this + 8),&local_40);
  for (this_00 = local_40.
                 super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      local_40.
      super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    pRVar1 = (this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar2 = (this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>).
                  _M_impl.super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
      std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::push_back
                ((__return_storage_ptr__->
                 super__Vector_base<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + pRVar2->pos,pRVar2);
    }
    pRVar2 = (this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pRVar2) {
      (this_00->super__Vector_base<tandem::Repeat,_std::allocator<tandem::Repeat>_>)._M_impl.
      super__Vector_impl_data._M_finish = pRVar2;
    }
    std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>::_M_shrink_to_fit(this_00);
  }
  std::
  vector<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>,_std::allocator<std::vector<tandem::Repeat,_std::allocator<tandem::Repeat>_>_>_>
  ::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Repeat>>
get_sorted_buckets(const T& str, const std::vector<LZBlock>& lz_blocks,
                   const std::uint32_t min_period, const std::uint32_t max_period)
{
    auto end_buckets = get_end_buckets(str, lz_blocks, min_period, max_period);
    auto result = get_init_buckets(str.size(), end_buckets);
    for (auto& bucket : end_buckets) {
        for (const auto& run : bucket) {
            result[run.pos].push_back(run);
        }
        bucket.clear();
        bucket.shrink_to_fit();
    }
    return result;
}